

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O2

int Cbs0_ManSolve(Cbs0_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Gia_Obj_t *pVar;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  uint uVar8;
  long lVar9;
  
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                  ,0x289,"int Cbs0_ManSolve(Cbs0_Man_t *, Gia_Obj_t *)");
  }
  if (((p->pJust).iHead == 0) && ((p->pJust).iTail == 0)) {
    (p->Pars).nBTThis = 0;
    (p->Pars).nJustThis = 0;
    Cbs0_ManAssign(p,pObj);
    uVar4 = Cbs0_ManSolve_rec(p);
    if ((uVar4 == 0) && (iVar5 = Cbs0_ManCheckLimits(p), iVar5 == 0)) {
      pVVar2 = p->vModel;
      pVVar2->nSize = 0;
      (p->pProp).iHead = 0;
      for (lVar9 = 0;
          (lVar9 < (p->pProp).iTail && (pVar = (p->pProp).pData[lVar9], pVar != (Gia_Obj_t *)0x0));
          lVar9 = lVar9 + 1) {
        uVar3 = *(ulong *)pVar;
        if ((~(uint)uVar3 & 0x9fffffff) == 0) {
          uVar6 = Cbs0_VarValue(pVar);
          iVar5 = pVVar2->nSize;
          if (iVar5 == pVVar2->nCap) {
            uVar8 = iVar5 * 2;
            if (iVar5 < 0x10) {
              uVar8 = 0x10;
            }
            piVar7 = pVVar2->pArray;
            if (iVar5 < (int)uVar8) {
              if (piVar7 == (int *)0x0) {
                piVar7 = (int *)malloc((ulong)uVar8 << 2);
              }
              else {
                piVar7 = (int *)realloc(piVar7,(ulong)uVar8 << 2);
              }
              pVVar2->pArray = piVar7;
              if (piVar7 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              pVVar2->nCap = uVar8;
              iVar5 = pVVar2->nSize;
            }
          }
          else {
            piVar7 = pVVar2->pArray;
          }
          pVVar2->nSize = iVar5 + 1;
          piVar7[iVar5] = (uVar6 | (uint)(uVar3 >> 0x1f) & 0x3ffffffe) ^ 1;
        }
      }
    }
    Cbs0_ManCancelUntil(p,0);
    (p->pJust).iHead = 0;
    (p->pJust).iTail = 0;
    iVar5 = (p->Pars).nJustThis;
    piVar7 = &(p->Pars).nBTTotal;
    *piVar7 = *piVar7 + (p->Pars).nBTThis;
    iVar1 = (p->Pars).nJustTotal;
    if (iVar5 < iVar1) {
      iVar5 = iVar1;
    }
    (p->Pars).nJustTotal = iVar5;
    iVar5 = Cbs0_ManCheckLimits(p);
    return -(uint)(iVar5 != 0) | uVar4;
  }
  __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                ,0x28a,"int Cbs0_ManSolve(Cbs0_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Cbs0_ManSolve( Cbs0_Man_t * p, Gia_Obj_t * pObj )
{
    int RetValue;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    p->Pars.nBTThis = p->Pars.nJustThis = 0;
    Cbs0_ManAssign( p, pObj );
    RetValue = Cbs0_ManSolve_rec( p );
    if ( RetValue == 0 && !Cbs0_ManCheckLimits(p) )
        Cbs0_ManSaveModel( p, p->vModel );
    Cbs0_ManCancelUntil( p, 0 );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Cbs0_ManCheckLimits( p ) )
        RetValue = -1;
//    printf( "Outcome = %2d.  Confs = %6d.  Decision level max = %3d.\n", 
//        RetValue, p->Pars.nBTThis, p->DecLevelMax );
    return RetValue;
}